

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O2

void eat_CWS(QByteArrayView *data)

{
  long lVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  eat_OWS(data);
  while ((lVar3 = data->m_size, lVar3 != 0 &&
         (pcVar4 = data->m_data, lVar6 = 1, lVar5 = 1, *pcVar4 == '('))) {
    do {
      while( true ) {
        while( true ) {
          if (lVar3 <= lVar6) {
            return;
          }
          lVar1 = lVar6 + 1;
          cVar2 = pcVar4[lVar6];
          if (cVar2 != '\\') break;
          if (lVar3 == lVar1) {
            return;
          }
          lVar6 = lVar6 + 2;
        }
        lVar6 = lVar1;
        if (cVar2 == ')') break;
        if (cVar2 == '(') {
          lVar5 = lVar5 + 1;
        }
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (lVar1 == 0) {
      return;
    }
    data->m_size = lVar3 - lVar1;
    data->m_data = pcVar4 + lVar1;
    eat_OWS(data);
  }
  return;
}

Assistant:

static constexpr void eat_CWS(QByteArrayView &data) noexcept
{
    eat_OWS(data);
    while (const auto comment = parse_comment(data)) {
        data = comment.tail;
        eat_OWS(data);
    }
}